

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

QMatchData * __thiscall
QSortedModelEngine::filter(QSortedModelEngine *this,QString *part,QModelIndex *parent,int param_4)

{
  bool bVar1;
  SortOrder SVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QMatchData *pQVar7;
  ulong uVar8;
  QMatchData *in_RCX;
  CaseSensitivity in_EDX;
  long in_RSI;
  QCompletionEngine *in_RDI;
  long in_FS_OFFSET;
  bool startsWith;
  int to;
  int from;
  int emi;
  bool exactMatch;
  int cmp;
  int probe;
  int low;
  int high;
  SortOrder order;
  QAbstractItemModel *model;
  QMatchData *m;
  QString probeData;
  QModelIndex probeIndex;
  QIndexMapper indices;
  QMatchData hint;
  undefined4 in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffccc;
  QMatchData *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  QMatchData *in_stack_fffffffffffffce0;
  QMatchData *this_00;
  QModelIndex *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  QCompletionEngine *this_01;
  undefined6 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd16;
  undefined1 uVar9;
  byte in_stack_fffffffffffffd17;
  undefined4 in_stack_fffffffffffffd18;
  int iVar10;
  undefined4 in_stack_fffffffffffffd1c;
  int iVar11;
  undefined4 in_stack_fffffffffffffd20;
  int iVar12;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 uVar13;
  int in_stack_fffffffffffffd28;
  int iVar14;
  int local_2d0;
  int local_2cc;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  QIndexMapper local_120 [3];
  undefined1 local_98 [48];
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar7 = (QMatchData *)QAbstractProxyModel::sourceModel();
  memset(local_98,0xaa,0x30);
  QMatchData::QMatchData(in_stack_fffffffffffffcd0);
  bVar1 = QCompletionEngine::lookupCache
                    (in_RDI,(QString *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)
                     ,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  if (bVar1) {
    QMatchData::QMatchData
              (in_stack_fffffffffffffcd0,
               (QMatchData *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    goto LAB_00a6be4b;
  }
  memset(local_120,0xaa,0x28);
  QIndexMapper::QIndexMapper(&in_stack_fffffffffffffcd0->indices);
  SVar2 = sortOrder((QSortedModelEngine *)this_01,(QModelIndex *)in_RDI);
  bVar1 = QCompletionEngine::matchHint
                    (in_RDI,(QString *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0)
                     ,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  if (bVar1) {
    bVar1 = QMatchData::isValid((QMatchData *)0xa6b62d);
    if (bVar1) {
      QIndexMapper::operator=
                (&in_stack_fffffffffffffcd0->indices,
                 (QIndexMapper *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      goto LAB_00a6b6ca;
    }
    QMatchData::QMatchData(in_stack_fffffffffffffcd0);
  }
  else {
    QString::QString((QString *)in_stack_fffffffffffffcd0,
                     (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    indexHint((QSortedModelEngine *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
              (QString *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
              (QModelIndex *)
              CONCAT17(in_stack_fffffffffffffd17,
                       CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)),
              (SortOrder)((ulong)in_RSI >> 0x20));
    QIndexMapper::operator=
              (&in_stack_fffffffffffffcd0->indices,
               (QIndexMapper *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6b6bd);
    QString::~QString((QString *)0xa6b6ca);
LAB_00a6b6ca:
    iVar3 = QIndexMapper::to(local_120);
    iVar4 = QIndexMapper::from(local_120);
    iVar14 = -0x55555556;
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    local_168 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0xa6b734);
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0xa6b76e);
    local_2d0 = iVar4 + -1;
    iVar3 = iVar3 + 1;
    while (local_2cc = iVar3, 1 < local_2cc - local_2d0) {
      iVar14 = (local_2cc + local_2d0) / 2;
      (**(code **)(*(long *)&pQVar7->indices + 0x60))
                (&local_1a8,pQVar7,iVar14,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xc0),in_RCX);
      local_178 = local_1a8;
      local_170 = local_1a0;
      local_168 = local_198;
      (**(code **)(*(long *)&pQVar7->indices + 0x90))
                (&local_28,pQVar7,&local_178,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xbc));
      ::QVariant::toString();
      QString::operator=((QString *)in_stack_fffffffffffffcd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0xa6b857);
      ::QVariant::~QVariant(&local_28);
      in_stack_fffffffffffffd28 =
           QString::compare((QString *)in_stack_fffffffffffffcd0,
                            (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8)
                            ,CaseInsensitive);
      iVar3 = iVar14;
      if (((SVar2 != AscendingOrder) || (in_stack_fffffffffffffd28 < 0)) &&
         ((SVar2 != DescendingOrder || (-1 < in_stack_fffffffffffffd28)))) {
        local_2d0 = iVar14;
        iVar3 = local_2cc;
      }
    }
    if (((SVar2 == AscendingOrder) &&
        (iVar3 = local_2d0, iVar4 = QIndexMapper::to(local_120), iVar3 == iVar4)) ||
       ((SVar2 == DescendingOrder &&
        (iVar3 = local_2cc, iVar4 = QIndexMapper::from(local_120), iVar3 == iVar4)))) {
      QString::QString((QString *)in_stack_fffffffffffffcd0,
                       (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QMatchData::QMatchData(in_stack_fffffffffffffcd0);
      QCompletionEngine::saveInCache
                ((QCompletionEngine *)CONCAT44(iVar14,in_stack_fffffffffffffd28),
                 (QString *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (QModelIndex *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (QMatchData *)
                 CONCAT17(in_stack_fffffffffffffd17,
                          CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
      QMatchData::~QMatchData((QMatchData *)0xa6b96a);
      QString::~QString((QString *)0xa6b977);
      QMatchData::QMatchData(in_stack_fffffffffffffcd0);
    }
    else {
      if (SVar2 == AscendingOrder) {
        iVar3 = local_2d0 + 1;
      }
      else {
        iVar3 = local_2cc + -1;
      }
      this_00 = pQVar7;
      (**(code **)(*(long *)&pQVar7->indices + 0x60))
                (&local_1f0,pQVar7,iVar3,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xc0),in_RCX);
      local_178 = local_1f0;
      local_170 = local_1e8;
      local_168 = local_1e0;
      (**(code **)(*(long *)&pQVar7->indices + 0x90))
                (&local_48,pQVar7,&local_178,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xbc));
      ::QVariant::toString();
      QString::operator=((QString *)in_stack_fffffffffffffcd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      QString::~QString((QString *)0xa6ba79);
      ::QVariant::~QVariant(&local_48);
      uVar8 = QString::startsWith((QString *)&local_190,in_EDX);
      if ((uVar8 & 1) == 0) {
        QString::QString((QString *)in_stack_fffffffffffffcd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        QMatchData::QMatchData(in_RCX);
        QCompletionEngine::saveInCache
                  ((QCompletionEngine *)CONCAT44(iVar14,in_stack_fffffffffffffd28),
                   (QString *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                   (QMatchData *)
                   CONCAT17(in_stack_fffffffffffffd17,
                            CONCAT16(in_stack_fffffffffffffd16,in_stack_fffffffffffffd10)));
        QMatchData::~QMatchData((QMatchData *)0xa6bb09);
        QString::~QString((QString *)0xa6bb16);
        QMatchData::QMatchData(in_RCX);
      }
      else {
        iVar4 = QString::compare((QString *)in_stack_fffffffffffffcd0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                                 CaseInsensitive);
        uVar13 = CONCAT13(iVar4 == 0,(int3)in_stack_fffffffffffffd24);
        if (iVar4 == 0) {
          if (SVar2 == AscendingOrder) {
            iVar4 = local_2d0 + 1;
            in_stack_fffffffffffffccc = iVar4;
          }
          else {
            iVar4 = local_2cc + -1;
            in_stack_fffffffffffffccc = iVar4;
          }
        }
        else {
          iVar4 = -1;
        }
        iVar11 = 0;
        iVar10 = 0;
        iVar12 = iVar4;
        if (SVar2 == AscendingOrder) {
          iVar11 = local_2d0 + 1;
          iVar5 = QIndexMapper::to(local_120);
          iVar6 = iVar11;
          local_2cc = iVar5 + 1;
        }
        else {
          iVar10 = local_2cc + -1;
          iVar6 = QIndexMapper::from(local_120);
          iVar6 = iVar6 + -1;
          local_2cc = iVar10;
        }
        while (local_2d0 = iVar6, 1 < local_2cc - local_2d0) {
          iVar14 = (local_2cc + local_2d0) / 2;
          (**(code **)(*(long *)&pQVar7->indices + 0x60))
                    (&local_238,pQVar7,iVar14,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xc0),
                     in_RCX);
          local_178 = local_238;
          local_170 = local_230;
          local_168 = local_228;
          (**(code **)(*(long *)&pQVar7->indices + 0x90))
                    (&local_68,pQVar7,&local_178,*(undefined4 *)(*(long *)(in_RSI + 0x68) + 0xbc));
          ::QVariant::toString();
          QString::operator=((QString *)in_stack_fffffffffffffcd0,
                             (QString *)CONCAT44(in_stack_fffffffffffffccc,iVar4));
          QString::~QString((QString *)0xa6bcef);
          ::QVariant::~QVariant(&local_68);
          in_stack_fffffffffffffd17 = QString::startsWith((QString *)&local_190,in_EDX);
          in_stack_fffffffffffffd17 = in_stack_fffffffffffffd17 & 1;
          iVar6 = iVar14;
          if (((SVar2 != AscendingOrder) || (in_stack_fffffffffffffd17 == 0)) &&
             ((SVar2 != DescendingOrder || (in_stack_fffffffffffffd17 != 0)))) {
            iVar6 = local_2d0;
            local_2cc = iVar14;
          }
        }
        uVar9 = 0;
        memset(in_RDI,0xaa,0x30);
        if (SVar2 == AscendingOrder) {
          QIndexMapper::QIndexMapper
                    (&in_stack_fffffffffffffcd0->indices,in_stack_fffffffffffffccc,iVar4);
        }
        else {
          QIndexMapper::QIndexMapper
                    (&in_stack_fffffffffffffcd0->indices,in_stack_fffffffffffffccc,iVar4);
        }
        QMatchData::QMatchData
                  (this_00,(QIndexMapper *)CONCAT44(iVar3,in_stack_fffffffffffffcd8),
                   (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffcd0 >> 0x18,0));
        QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6bdd0);
        QString::QString((QString *)in_stack_fffffffffffffcd0,
                         (QString *)CONCAT44(in_stack_fffffffffffffccc,iVar4));
        QCompletionEngine::saveInCache
                  ((QCompletionEngine *)CONCAT44(iVar14,in_stack_fffffffffffffd28),
                   (QString *)CONCAT44(uVar13,iVar12),(QModelIndex *)CONCAT44(iVar11,iVar10),
                   (QMatchData *)
                   CONCAT17(in_stack_fffffffffffffd17,CONCAT16(uVar9,in_stack_fffffffffffffd10)));
        QString::~QString((QString *)0xa6be11);
      }
    }
    QString::~QString((QString *)0xa6be3e);
  }
  QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6be4b);
LAB_00a6be4b:
  QMatchData::~QMatchData((QMatchData *)0xa6be58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QMatchData *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QMatchData QSortedModelEngine::filter(const QString& part, const QModelIndex& parent, int)
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    QMatchData hint;
    if (lookupCache(part, parent, &hint))
        return hint;

    QIndexMapper indices;
    Qt::SortOrder order = sortOrder(parent);

    if (matchHint(part, parent, &hint)) {
        if (!hint.isValid())
            return QMatchData();
        indices = hint.indices;
    } else {
        indices = indexHint(part, parent, order);
    }

    // binary search the model within 'indices' for 'part' under 'parent'
    int high = indices.to() + 1;
    int low = indices.from() - 1;
    int probe;
    QModelIndex probeIndex;
    QString probeData;

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const int cmp = QString::compare(probeData, part, c->cs);
        if ((order == Qt::AscendingOrder && cmp >= 0)
            || (order == Qt::DescendingOrder && cmp < 0)) {
            high = probe;
        } else {
            low = probe;
        }
    }

    if ((order == Qt::AscendingOrder && low == indices.to())
        || (order == Qt::DescendingOrder && high == indices.from())) { // not found
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    probeIndex = model->index(order == Qt::AscendingOrder ? low+1 : high-1, c->column, parent);
    probeData = model->data(probeIndex, c->role).toString();
    if (!probeData.startsWith(part, c->cs)) {
        saveInCache(part, parent, QMatchData());
        return QMatchData();
    }

    const bool exactMatch = QString::compare(probeData, part, c->cs) == 0;
    int emi =  exactMatch ? (order == Qt::AscendingOrder ? low+1 : high-1) : -1;

    int from = 0;
    int to = 0;
    if (order == Qt::AscendingOrder) {
        from = low + 1;
        high = indices.to() + 1;
        low = from;
    } else {
        to = high - 1;
        low = indices.from() - 1;
        high = to;
    }

    while (high - low > 1)
    {
        probe = (high + low) / 2;
        probeIndex = model->index(probe, c->column, parent);
        probeData = model->data(probeIndex, c->role).toString();
        const bool startsWith = probeData.startsWith(part, c->cs);
        if ((order == Qt::AscendingOrder && startsWith)
            || (order == Qt::DescendingOrder && !startsWith)) {
            low = probe;
        } else {
            high = probe;
        }
    }

    QMatchData m(order == Qt::AscendingOrder ? QIndexMapper(from, high - 1) : QIndexMapper(low+1, to), emi, false);
    saveInCache(part, parent, m);
    return m;
}